

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall QByteArray::setRawData(QByteArray *this,char *data,qsizetype size)

{
  QArrayData *data_00;
  
  data_00 = &((this->d).d)->super_QArrayData;
  if (data == (char *)0x0 || size == 0) {
    (this->d).d = (Data *)0x0;
    (this->d).ptr = (char *)0x0;
    (this->d).size = 0;
  }
  else {
    (this->d).d = (Data *)0x0;
    (this->d).ptr = data;
    (this->d).size = size;
  }
  if (data_00 != (QArrayData *)0x0) {
    LOCK();
    (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
         (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data_00,1,0x10);
    }
  }
  return this;
}

Assistant:

QByteArray &QByteArray::setRawData(const char *data, qsizetype size)
{
    if (!data || !size)
        clear();
    else
        *this = fromRawData(data, size);
    return *this;
}